

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

string * __thiscall
Kernel::Clause::literalsOnlyToString_abi_cxx11_(string *__return_storage_ptr__,Clause *this)

{
  long lVar1;
  ulong uVar2;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  uVar2 = *(ulong *)&this->field_0x38;
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  if ((uVar2 & 0xfffff) == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"$false","");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    Literal::toString_abi_cxx11_(&local_58,this->_literals[0]);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      ::operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((*(uint *)&this->field_0x38 & 0xffffe) != 0) {
      lVar1 = 0xf;
      do {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        Literal::toString_abi_cxx11_(&local_58,this->_literals[lVar1 + -0xe]);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          ::operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        uVar2 = lVar1 - 0xd;
        lVar1 = lVar1 + 1;
      } while (uVar2 < ((uint)*(undefined8 *)&this->field_0x38 & 0xfffff));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Clause::literalsOnlyToString() const
{
  if (_length == 0) {
    return "$false";
  } else {
    std::string result;
    result += _literals[0]->toString();
    for(unsigned i = 1; i < _length; i++) {
      result += " | ";
      result += _literals[i]->toString();
    }
    return result;
  }
}